

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::AbortedRead::tryRead
          (AbortedRead *this,void *readBufferPtr,size_t minBytes,size_t maxBytes)

{
  String local_1d8;
  Exception local_1c0;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *readBufferPtr_local;
  AbortedRead *this_local;
  
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  readBufferPtr_local = readBufferPtr;
  this_local = this;
  kj::_::Debug::makeDescription<char_const(&)[28]>
            (&local_1d8,(Debug *)"\"abortRead() has been called\"","abortRead() has been called",
             (char (*) [28])maxBytes);
  Exception::Exception
            (&local_1c0,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x588,&local_1d8);
  Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,&local_1c0);
  Exception::~Exception(&local_1c0);
  String::~String(&local_1d8);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* readBufferPtr, size_t minBytes, size_t maxBytes) override {
      return KJ_EXCEPTION(DISCONNECTED, "abortRead() has been called");
    }